

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

int sexp_buffered_write_char(sexp ctx,int c,sexp p)

{
  int iVar1;
  sexp psVar2;
  sexp psVar3;
  
  psVar2 = (p->value).type.print;
  psVar3 = (sexp)((long)&psVar2->tag + 1);
  if ((sexp)(p->value).port.size <= psVar3) {
    iVar1 = sexp_buffered_flush(ctx,p,0);
    if (iVar1 != 0) {
      return iVar1;
    }
    psVar2 = (p->value).type.print;
    psVar3 = (sexp)((long)&psVar2->tag + 1);
  }
  (p->value).type.print = psVar3;
  *(char *)((long)&psVar2->tag + (long)&((p->value).type.setters)->tag) = (char)c;
  return 0;
}

Assistant:

int sexp_buffered_write_char (sexp ctx, int c, sexp p) {
  int res;
  if (sexp_port_offset(p)+1 >= sexp_port_size(p))
    if ((res = sexp_buffered_flush(ctx, p, 0)))
      return res;
  sexp_port_buf(p)[sexp_port_offset(p)++] = c;
  return 0;
}